

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall MarrayTest::resizeTest<(andres::CoordinateOrder)1>(MarrayTest *this)

{
  pointer piVar1;
  value_type *__val;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  size_t sVar3;
  reference piVar4;
  size_t sVar5;
  size_t sVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  logic_error *plVar8;
  code *pcVar9;
  CoordinateOrder CVar10;
  value_type *__val_10;
  long lVar11;
  ulong uVar12;
  undefined *puVar13;
  int iVar14;
  ulong uVar15;
  value_type *__val_2;
  uint args;
  value_type *__val_15;
  bool bVar16;
  int scalar_1;
  int scalar;
  Marray<int,_std::allocator<unsigned_long>_> m;
  CoordinateOrder local_a0;
  int local_9c;
  MarrayTest *local_98;
  Marray<int,_std::allocator<unsigned_long>_> local_90;
  unsigned_long *local_48;
  unsigned_long *local_40;
  unsigned_long *local_38;
  
  _Var2._M_current = (unsigned_long *)operator_new(8);
  *_Var2._M_current = 0x18;
  local_a0 = LastMajorOrder;
  local_98 = this;
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 1),&this->scalar_,&local_a0,(allocator_type *)&local_9c);
  *_Var2._M_current = 0xc;
  local_a0 = 0xc;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 1),(int *)&local_a0);
  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
  if ((sVar3 == 0xc) &&
     (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0xc)) {
    if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      pcVar9 = std::runtime_error::~runtime_error;
      puVar13 = &std::runtime_error::typeinfo;
      goto LAB_001e15f3;
    }
    if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ == 1) {
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,0x30);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      operator_delete(_Var2._M_current,8);
      _Var2._M_current = (unsigned_long *)operator_new(8);
      *_Var2._M_current = 0x18;
      local_a0 = LastMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var2._M_current + 1),&local_98->scalar_,&local_a0,(allocator_type *)&local_9c);
      local_a0 = LastMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )0x0,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )0x0,(int *)&local_a0);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                      local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ << 2);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      operator_delete(_Var2._M_current,8);
      _Var2._M_current = (unsigned_long *)operator_new(8);
      *_Var2._M_current = 0x18;
      local_a0 = LastMajorOrder;
      andres::Marray<int,std::allocator<unsigned_long>>::
      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var2._M_current + 1),&local_98->scalar_,&local_a0,(allocator_type *)&local_9c);
      *_Var2._M_current = 1;
      local_a0 = 3;
      andres::Marray<int,std::allocator<unsigned_long>>::
      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var2._M_current + 1),(int *)&local_a0);
      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
      if ((sVar3 != 1) ||
         (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ != 1)) {
LAB_001e147a:
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_a0 = FirstMajorOrder;
      piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,false,std::allocator<unsigned_long>>
                         (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,
                          (int *)&local_a0);
      if (*piVar4 != local_98->scalar_) goto LAB_001e147a;
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                      local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ << 2);
      operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                             geometry_.dimension_ * 0x18);
      operator_delete(_Var2._M_current,8);
      local_9c = 1;
      _Var2._M_current = (unsigned_long *)operator_new(8);
      *_Var2._M_current = 0x18;
      andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                (&local_90,&local_9c,&andres::defaultOrder,(allocator_type *)&local_a0);
      local_a0 = 3;
      andres::Marray<int,std::allocator<unsigned_long>>::
      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var2._M_current + 1),(int *)&local_a0);
      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
      if ((sVar3 == 0x18) &&
         (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ == 0x18))
      {
        if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ == (pointer)0x0) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          pcVar9 = std::runtime_error::~runtime_error;
          puVar13 = &std::runtime_error::typeinfo;
          goto LAB_001e1625;
        }
        if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_ ==
            1) {
          local_a0 = FirstMajorOrder;
          piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                   execute<int,int,false,std::allocator<unsigned_long>>
                             (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,
                              (int *)&local_a0);
          if (*piVar4 != 1) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          CVar10 = LastMajorOrder;
          do {
            local_a0 = CVar10;
            piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>
                               (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,
                                (int *)&local_a0);
            if (*piVar4 != 3) {
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar8,"test failed.");
              __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            CVar10 = CVar10 + LastMajorOrder;
          } while (CVar10 != 0x18);
          operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                          local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          size_ << 2);
          operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                          shape_,local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                 geometry_.dimension_ * 0x18);
          operator_delete(_Var2._M_current,8);
          _Var2._M_current = (unsigned_long *)operator_new(8);
          *_Var2._M_current = 0xc;
          local_a0 = LastMajorOrder;
          andres::Marray<int,std::allocator<unsigned_long>>::
          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var2._M_current + 1),&local_98->scalar_,&local_a0,
                     (allocator_type *)&local_9c);
          *_Var2._M_current = 0x18;
          local_a0 = 3;
          andres::Marray<int,std::allocator<unsigned_long>>::
          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Marray<int,std::allocator<unsigned_long>> *)&local_90,_Var2,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var2._M_current + 1),(int *)&local_a0);
          sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                            (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,0);
          if ((sVar3 == 0x18) &&
             (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.size_ ==
              0x18)) {
            if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                (pointer)0x0) {
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              pcVar9 = std::runtime_error::~runtime_error;
              puVar13 = &std::runtime_error::typeinfo;
              goto LAB_001e1689;
            }
            if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.dimension_
                == 1) {
              CVar10 = FirstMajorOrder;
              do {
                local_a0 = CVar10;
                if (CVar10 < 0xc) {
                  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>
                                     (&local_90.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>,
                                      (int *)&local_a0);
                  if (*piVar4 != local_98->scalar_) {
                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar8,"test failed.");
                    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                }
                else {
                  piVar4 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>
                                     (&local_90.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>,
                                      (int *)&local_a0);
                  if (*piVar4 != 3) {
                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar8,"test failed.");
                    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                }
                CVar10 = CVar10 + LastMajorOrder;
              } while (CVar10 != 0x18);
              operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ << 2);
              operator_delete(local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.shape_,
                              local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.dimension_ * 0x18);
              operator_delete(_Var2._M_current,8);
              local_a0 = LastMajorOrder;
              andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
                        (&local_90,(int *)&local_a0,&andres::defaultOrder,
                         (allocator_type *)&local_9c);
              local_48 = (unsigned_long *)operator_new(0x18);
              *local_48 = 0;
              local_48[1] = 0;
              *local_48 = 5;
              local_48[1] = 5;
              local_48[2] = 2;
              local_9c = 3;
              andres::Marray<int,std::allocator<unsigned_long>>::
              resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_48,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(local_48 + 3),&local_9c);
              sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,0)
              ;
              if (sVar3 == 5) {
                sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                  (&local_90.super_View<int,_false,_std::allocator<unsigned_long>_>,
                                   1);
                if (sVar3 == 5) {
                  sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                    (&local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>,2);
                  if ((sVar3 == 2) &&
                     (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                      size_ == 0x32)) {
                    if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.data_ ==
                        (pointer)0x0) {
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.")
                      ;
                      pcVar9 = std::runtime_error::~runtime_error;
                      puVar13 = &std::runtime_error::typeinfo;
                      goto LAB_001e131d;
                    }
                    if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.geometry_.
                        dimension_ == 3) {
                      iVar14 = 0;
                      do {
                        sVar3 = 0;
                        do {
                          lVar11 = 0;
                          do {
                            if (((int)sVar3 == 0 && (int)lVar11 == 0) && iVar14 == 0) {
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              piVar1 = local_90.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>.data_;
                              if ((local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                   data_ == (pointer)0x0) ||
                                 (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ != 3)) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar8,"Assertion failed.");
                                pcVar9 = std::runtime_error::~runtime_error;
                                puVar13 = &std::runtime_error::typeinfo;
LAB_001e0eef:
                                __cxa_throw(plVar8,puVar13,pcVar9);
                              }
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::strides
                                        (&local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>,0);
                              sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      elementAccessHelper<int>
                                                (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                 ,3,0,0);
                              if (piVar1[sVar5] != 1) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar8,"test failed.");
                                pcVar9 = std::logic_error::~logic_error;
                                puVar13 = &std::logic_error::typeinfo;
                                goto LAB_001e0eef;
                              }
                            }
                            else {
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant(&local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>)
                              ;
                              piVar1 = local_90.
                                       super_View<int,_false,_std::allocator<unsigned_long>_>.data_;
                              if ((local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                   data_ == (pointer)0x0) ||
                                 (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                  geometry_.dimension_ != 3)) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar8,"Assertion failed.");
                                pcVar9 = std::runtime_error::~runtime_error;
                                puVar13 = &std::runtime_error::typeinfo;
LAB_001e0e33:
                                __cxa_throw(plVar8,puVar13,pcVar9);
                              }
                              sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      strides(&local_90.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                              ,0);
                              sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      elementAccessHelper<int>
                                                (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                 ,3,sVar3,iVar14);
                              if (piVar1[sVar5 * lVar11 + sVar6] != 3) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar8,"test failed.");
                                pcVar9 = std::logic_error::~logic_error;
                                puVar13 = &std::logic_error::typeinfo;
                                goto LAB_001e0e33;
                              }
                            }
                            lVar11 = lVar11 + 1;
                          } while (lVar11 != 5);
                          sVar3 = sVar3 + 1;
                        } while (sVar3 != 5);
                        bVar16 = iVar14 == 0;
                        iVar14 = iVar14 + 1;
                      } while (bVar16);
                      operator_delete(local_48,0x18);
                      operator_delete(local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_,
                                      local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.size_ << 2);
                      operator_delete(local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.shape_,
                                      local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ * 0x18);
                      local_38 = (unsigned_long *)operator_new(8);
                      *local_38 = 0xc;
                      local_a0 = LastMajorOrder;
                      andres::Marray<int,std::allocator<unsigned_long>>::
                      Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_38,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(local_38 + 1),&local_98->scalar_,&local_a0,
                                 (allocator_type *)&local_9c);
                      local_40 = (unsigned_long *)operator_new(0x18);
                      *local_40 = 0;
                      local_40[1] = 0;
                      *local_40 = 5;
                      local_40[1] = 5;
                      local_40[2] = 2;
                      local_a0 = 3;
                      andres::Marray<int,std::allocator<unsigned_long>>::
                      resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_40,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(local_40 + 3),(int *)&local_a0);
                      sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                        (&local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>,0);
                      if (sVar3 == 5) {
                        sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                          (&local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>,1
                                          );
                        if (sVar3 == 5) {
                          sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                                            (&local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                             ,2);
                          if ((sVar3 == 2) &&
                             (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                              geometry_.size_ == 0x32)) {
                            if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                data_ == (pointer)0x0) {
                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar8,"Assertion failed.");
                              pcVar9 = std::runtime_error::~runtime_error;
                              puVar13 = &std::runtime_error::typeinfo;
                              goto LAB_001e134f;
                            }
                            if (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                geometry_.dimension_ == 3) {
                              local_48 = (unsigned_long *)0x0;
                              do {
                                sVar3 = 0;
                                do {
                                  iVar14 = (int)local_48;
                                  lVar11 = 0;
                                  do {
                                    if (iVar14 == 0 && (int)sVar3 == 0) {
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      piVar1 = local_90.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                               .data_;
                                      if ((local_90.
                                           super_View<int,_false,_std::allocator<unsigned_long>_>.
                                           data_ == (pointer)0x0) ||
                                         (local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ != 3)) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar8,"Assertion failed.");
                                        pcVar9 = std::runtime_error::~runtime_error;
                                        puVar13 = &std::runtime_error::typeinfo;
LAB_001e1009:
                                        __cxa_throw(plVar8,puVar13,pcVar9);
                                      }
                                      sVar5 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                      sVar6 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              elementAccessHelper<int>
                                                        (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,0,0);
                                      if (piVar1[sVar5 * lVar11 + sVar6] != local_98->scalar_) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar8,"test failed.");
                                        pcVar9 = std::logic_error::~logic_error;
                                        puVar13 = &std::logic_error::typeinfo;
                                        goto LAB_001e1009;
                                      }
                                    }
                                    else {
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                      piVar1 = local_90.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                               .data_;
                                      if ((local_90.
                                           super_View<int,_false,_std::allocator<unsigned_long>_>.
                                           data_ == (pointer)0x0) ||
                                         (local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.dimension_ != 3)) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar8,"Assertion failed.");
                                        pcVar9 = std::runtime_error::~runtime_error;
                                        puVar13 = &std::runtime_error::typeinfo;
LAB_001e0e91:
                                        __cxa_throw(plVar8,puVar13,pcVar9);
                                      }
                                      sVar5 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                      sVar6 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              elementAccessHelper<int>
                                                        (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar3,(int)local_48);
                                      if (piVar1[sVar5 * lVar11 + sVar6] != 3) {
                                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar8,"test failed.");
                                        pcVar9 = std::logic_error::~logic_error;
                                        puVar13 = &std::logic_error::typeinfo;
                                        goto LAB_001e0e91;
                                      }
                                    }
                                    lVar11 = lVar11 + 1;
                                  } while (lVar11 != 5);
                                  sVar3 = sVar3 + 1;
                                } while (sVar3 != 5);
                                iVar14 = (int)local_48;
                                local_48 = (unsigned_long *)(ulong)(iVar14 + 1);
                              } while (iVar14 == 0);
                              operator_delete(local_40,0x18);
                              operator_delete(local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                              operator_delete(local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.shape_,
                                              local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.dimension_ * 0x18);
                              operator_delete(local_38,8);
                              _Var2._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var2._M_current = 0;
                              _Var2._M_current[1] = 0;
                              *_Var2._M_current = 6;
                              _Var2._M_current[1] = 4;
                              local_a0 = LastMajorOrder;
                              andres::Marray<int,std::allocator<unsigned_long>>::
                              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                         _Var2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var2._M_current + 2),&local_98->scalar_,&local_a0
                                         ,(allocator_type *)&local_9c);
                              *_Var2._M_current = 3;
                              _Var2._M_current[1] = 2;
                              local_a0 = 6;
                              andres::Marray<int,std::allocator<unsigned_long>>::
                              resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Marray<int,std::allocator<unsigned_long>> *)&local_90,
                                         _Var2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var2._M_current + 2),(int *)&local_a0);
                              sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      shape(&local_90.
                                             super_View<int,_false,_std::allocator<unsigned_long>_>,
                                            0);
                              if (sVar3 == 3) {
                                sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                        shape(&local_90.
                                               super_View<int,_false,_std::allocator<unsigned_long>_>
                                              ,1);
                                if ((sVar3 == 2) &&
                                   (local_90.super_View<int,_false,_std::allocator<unsigned_long>_>.
                                    geometry_.size_ == 6)) {
                                  if (local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.data_
                                      == (pointer)0x0) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                    pcVar9 = std::runtime_error::~runtime_error;
                                    puVar13 = &std::runtime_error::typeinfo;
                                    goto LAB_001e1719;
                                  }
                                  if (local_90.
                                      super_View<int,_false,_std::allocator<unsigned_long>_>.
                                      geometry_.dimension_ == 2) {
                                    operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,0x18);
                                    operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                    operator_delete(_Var2._M_current,0x10);
                                    _Var2._M_current = (unsigned_long *)operator_new(0x10);
                                    *_Var2._M_current = 0;
                                    _Var2._M_current[1] = 0;
                                    *_Var2._M_current = 3;
                                    _Var2._M_current[1] = 2;
                                    local_a0 = LastMajorOrder;
                                    andres::Marray<int,std::allocator<unsigned_long>>::
                                    Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                              ((Marray<int,std::allocator<unsigned_long>> *)
                                               &local_90,_Var2,
                                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var2._M_current + 2),&local_98->scalar_,&local_a0
                                               ,(allocator_type *)&local_9c);
                                    *_Var2._M_current = 6;
                                    _Var2._M_current[1] = 4;
                                    local_a0 = 3;
                                    andres::Marray<int,std::allocator<unsigned_long>>::
                                    resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                              ((Marray<int,std::allocator<unsigned_long>> *)
                                               &local_90,_Var2,
                                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var2._M_current + 2),(int *)&local_a0);
                                    sVar3 = andres::View<int,_false,_std::allocator<unsigned_long>_>
                                            ::shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                    if (sVar3 == 6) {
                                      sVar3 = andres::
                                              View<int,_false,_std::allocator<unsigned_long>_>::
                                              shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                      if ((sVar3 == 4) &&
                                         (local_90.
                                          super_View<int,_false,_std::allocator<unsigned_long>_>.
                                          geometry_.size_ == 0x18)) {
                                        if (local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            data_ == (pointer)0x0) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar8,"Assertion failed.");
                                          pcVar9 = std::runtime_error::~runtime_error;
                                          puVar13 = &std::runtime_error::typeinfo;
                                          goto LAB_001e174b;
                                        }
                                        if (local_90.
                                            super_View<int,_false,_std::allocator<unsigned_long>_>.
                                            geometry_.dimension_ == 2) {
                                          args = 0;
                                          do {
                                            uVar15 = 0;
                                            do {
                                              if (uVar15 < 3 && args < 2) {
                                                piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,uVar15,args);
                                                if (*piVar4 != local_98->scalar_) {
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                              }
                                              else {
                                                piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,uVar15,args);
                                                if (*piVar4 != 3) {
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                              }
                                              uVar15 = uVar15 + 1;
                                            } while (uVar15 != 6);
                                            args = args + 1;
                                          } while (args != 4);
                                          operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(_Var2._M_current,0x10);
                                          _Var2._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var2._M_current = 0;
                                          _Var2._M_current[1] = 0;
                                          *_Var2._M_current = 6;
                                          _Var2._M_current[1] = 4;
                                          local_a0 = LastMajorOrder;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_90,_Var2,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 2),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                          local_a0 = 3;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_90,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(int *)&local_a0);
                                          operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(_Var2._M_current,0x10);
                                          _Var2._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var2._M_current = 0;
                                          _Var2._M_current[1] = 0;
                                          *_Var2._M_current = 6;
                                          _Var2._M_current[1] = 4;
                                          local_a0 = LastMajorOrder;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_90,_Var2,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 2),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                          _Var7._M_current = (unsigned_long *)operator_new(8);
                                          *_Var7._M_current = 0xc;
                                          local_a0 = 3;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_90,_Var7,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),(int *)&local_a0);
                                          sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                          if ((sVar3 != 0xc) ||
                                             (local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.size_ != 0xc)) {
                                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar8,"test failed.");
                                            __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          operator_delete(_Var7._M_current,8);
                                          operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                          operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                          operator_delete(_Var2._M_current,0x10);
                                          _Var2._M_current = (unsigned_long *)operator_new(0x10);
                                          *_Var2._M_current = 0;
                                          _Var2._M_current[1] = 0;
                                          *_Var2._M_current = 6;
                                          _Var2._M_current[1] = 4;
                                          local_a0 = LastMajorOrder;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_90,_Var2,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 2),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                          _Var7._M_current = (unsigned_long *)operator_new(8);
                                          *_Var7._M_current = 0xc;
                                          local_a0 = 3;
                                          andres::Marray<int,std::allocator<unsigned_long>>::
                                          resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Marray<int,std::allocator<unsigned_long>> *)
                                                     &local_90,_Var7,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),(int *)&local_a0);
                                          sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                          if ((sVar3 == 0xc) &&
                                             (local_90.
                                              super_View<int,_false,_std::allocator<unsigned_long>_>
                                              .geometry_.size_ == 0xc)) {
                                            if (local_90.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .data_ == (pointer)0x0) {
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar8,"Assertion failed."
                                                        );
                                              pcVar9 = std::runtime_error::~runtime_error;
                                              puVar13 = &std::runtime_error::typeinfo;
                                              goto LAB_001e17af;
                                            }
                                            if (local_90.
                                                super_View<int,_false,_std::allocator<unsigned_long>_>
                                                .geometry_.dimension_ == 1) {
                                              CVar10 = FirstMajorOrder;
                                              do {
                                                local_a0 = CVar10;
                                                piVar4 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a0);
                                                if (*piVar4 != local_98->scalar_) {
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                                CVar10 = CVar10 + LastMajorOrder;
                                              } while (CVar10 != 6);
                                              CVar10 = 6;
                                              do {
                                                local_a0 = CVar10;
                                                piVar4 = andres::marray_detail::
                                                         AccessOperatorHelper<true>::
                                                                                                                  
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a0);
                                                if (*piVar4 != 3) {
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                              std::logic_error::~logic_error);
                                                }
                                                CVar10 = CVar10 + LastMajorOrder;
                                              } while (CVar10 != 0xc);
                                              operator_delete(_Var7._M_current,8);
                                              operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                              operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                              operator_delete(_Var2._M_current,0x10);
                                              local_38 = (unsigned_long *)operator_new(0x10);
                                              *local_38 = 0;
                                              local_38[1] = 0;
                                              *local_38 = 3;
                                              local_38[1] = 2;
                                              local_a0 = LastMajorOrder;
                                              andres::Marray<int,std::allocator<unsigned_long>>::
                                              Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Marray<int,std::allocator<unsigned_long>>
                                                          *)&local_90,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_38,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_38 + 2),&local_98->scalar_,&local_a0,
                                                  (allocator_type *)&local_9c);
                                              local_40 = (unsigned_long *)operator_new(0x18);
                                              *local_40 = 0;
                                              local_40[1] = 0;
                                              *local_40 = 5;
                                              local_40[1] = 5;
                                              local_40[2] = 2;
                                              local_a0 = 3;
                                              andres::Marray<int,std::allocator<unsigned_long>>::
                                              resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Marray<int,std::allocator<unsigned_long>>
                                                          *)&local_90,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 3),(int *)&local_a0);
                                              sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                              if (sVar3 == 5) {
                                                sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                if (sVar3 == 5) {
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,2);
                                                  if ((sVar3 == 2) &&
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0x32)) {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e1381;
                                                  }
                                                  if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 3) {
                                                    local_48 = (unsigned_long *)0x0;
                                                    do {
                                                      uVar15 = 0;
                                                      do {
                                                        bVar16 = (int)local_48 == 0;
                                                        uVar12 = 0;
                                                        do {
                                                          if (uVar12 < 3 && (uVar15 < 2 && bVar16))
                                                          {
                                                            andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar1 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001e0f4d:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,uVar15,0);
                                                  if (piVar1[sVar3 * uVar12 + sVar5] !=
                                                      local_98->scalar_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001e0f4d;
                                                  }
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar1 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001e0fab:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,uVar15,(int)local_48);
                                                  if (piVar1[sVar3 * uVar12 + sVar5] != 3) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001e0fab;
                                                  }
                                                  }
                                                  uVar12 = uVar12 + 1;
                                                  } while (uVar12 != 5);
                                                  uVar15 = uVar15 + 1;
                                                  } while (uVar15 != 5);
                                                  iVar14 = (int)local_48;
                                                  local_48 = (unsigned_long *)(ulong)(iVar14 + 1);
                                                  } while (iVar14 == 0);
                                                  operator_delete(local_40,0x18);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_38,0x10);
                                                  _Var2._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var2._M_current = 0;
                                                  _Var2._M_current[1] = 0;
                                                  *_Var2._M_current = 3;
                                                  _Var2._M_current[1] = 4;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = LastMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                                  *_Var2._M_current = 2;
                                                  _Var2._M_current[1] = 2;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = 8;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),(int *)&local_a0);
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if (sVar3 == 2) {
                                                    sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                  if (sVar3 == 2) {
                                                    sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,2);
                                                  if ((sVar3 == 2) &&
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 8)) {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e13b3;
                                                  }
                                                  if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 3) {
                                                    operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,0x20);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var2._M_current,0x18);
                                                  _Var2._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var2._M_current = 0;
                                                  _Var2._M_current[1] = 0;
                                                  *_Var2._M_current = 3;
                                                  _Var2._M_current[1] = 4;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = LastMajorOrder;
                                                  local_48 = _Var2._M_current;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                                  *_Var2._M_current = 5;
                                                  _Var2._M_current[1] = 5;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),(int *)&local_a0);
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if (sVar3 == 5) {
                                                    sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                  if (sVar3 == 5) {
                                                    sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,2);
                                                  if ((sVar3 == 2) &&
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0x32)) {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e13e5;
                                                  }
                                                  if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 3) {
                                                    iVar14 = 0;
                                                    do {
                                                      sVar3 = 0;
                                                      do {
                                                        uVar15 = 0;
                                                        do {
                                                          if (uVar15 < 3 && sVar3 != 4) {
                                                            andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar1 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001e1067:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  sVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar3,iVar14);
                                                  if (piVar1[sVar5 * uVar15 + sVar6] !=
                                                      local_98->scalar_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001e1067;
                                                  }
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  );
                                                  piVar1 = local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_;
                                                  if ((local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) ||
                                                  (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ != 3)) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_001e10c5:
                                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  sVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  sVar6 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,3,sVar3,iVar14);
                                                  if (piVar1[sVar5 * uVar15 + sVar6] != 3) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    pcVar9 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_001e10c5;
                                                  }
                                                  }
                                                  uVar15 = uVar15 + 1;
                                                  } while (uVar15 != 5);
                                                  sVar3 = sVar3 + 1;
                                                  } while (sVar3 != 5);
                                                  bVar16 = iVar14 == 0;
                                                  iVar14 = iVar14 + 1;
                                                  } while (bVar16);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(local_48,0x18);
                                                  _Var2._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var2._M_current = 0;
                                                  _Var2._M_current[1] = 0;
                                                  *_Var2._M_current = 3;
                                                  _Var2._M_current[1] = 4;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = LastMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                                  local_a0 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )0x0,(int *)&local_a0);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var2._M_current,0x18);
                                                  _Var2._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var2._M_current = 0;
                                                  _Var2._M_current[1] = 0;
                                                  *_Var2._M_current = 3;
                                                  _Var2._M_current[1] = 4;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = LastMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0xc;
                                                  local_a0 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),(int *)&local_a0);
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if ((sVar3 != 0xc) ||
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ != 0xc)) {
LAB_001e1568:
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  local_a0 = FirstMajorOrder;
                                                  piVar4 = andres::marray_detail::
                                                           AccessOperatorHelper<true>::
                                                                                                                      
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a0);
                                                  if (*piVar4 != local_98->scalar_)
                                                  goto LAB_001e1568;
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var2._M_current,0x18);
                                                  _Var2._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var2._M_current = 0;
                                                  _Var2._M_current[1] = 0;
                                                  *_Var2._M_current = 3;
                                                  _Var2._M_current[1] = 4;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = LastMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var7._M_current = 0xc;
                                                  local_a0 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 1),(int *)&local_a0);
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if ((sVar3 == 0xc) &&
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0xc)) {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e186e;
                                                  }
                                                  if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 1) {
                                                    CVar10 = FirstMajorOrder;
                                                    do {
                                                      local_a0 = CVar10;
                                                      piVar4 = andres::marray_detail::
                                                               AccessOperatorHelper<true>::
                                                                                                                              
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a0);
                                                  if (*piVar4 != local_98->scalar_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  CVar10 = CVar10 + LastMajorOrder;
                                                  } while (CVar10 != 3);
                                                  CVar10 = 3;
                                                  do {
                                                    local_a0 = CVar10;
                                                    piVar4 = andres::marray_detail::
                                                             AccessOperatorHelper<true>::
                                                                                                                          
                                                  execute<int,int,false,std::allocator<unsigned_long>>
                                                            (&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,(int *)&local_a0);
                                                  if (*piVar4 != 3) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  CVar10 = CVar10 + LastMajorOrder;
                                                  } while (CVar10 != 0xc);
                                                  operator_delete(_Var7._M_current,8);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var2._M_current,0x18);
                                                  _Var2._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var2._M_current = 0;
                                                  _Var2._M_current[1] = 0;
                                                  *_Var2._M_current = 3;
                                                  _Var2._M_current[1] = 4;
                                                  _Var2._M_current[2] = 2;
                                                  local_a0 = LastMajorOrder;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var2,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var2._M_current + 3),&local_98->scalar_,
                                                  &local_a0,(allocator_type *)&local_9c);
                                                  _Var7._M_current =
                                                       (unsigned_long *)operator_new(0x10);
                                                  *_Var7._M_current = 0;
                                                  _Var7._M_current[1] = 0;
                                                  *_Var7._M_current = 6;
                                                  _Var7._M_current[1] = 4;
                                                  local_a0 = 3;
                                                  andres::Marray<int,std::allocator<unsigned_long>>
                                                  ::
                                                  resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Marray<int,std::allocator<unsigned_long>> *)
                                                  &local_90,_Var7,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var7._M_current + 2),(int *)&local_a0);
                                                  sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,0);
                                                  if (sVar3 == 6) {
                                                    sVar3 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  shape(&local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  ,1);
                                                  if ((sVar3 == 4) &&
                                                     (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ == 0x18)) {
                                                    if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_ == (pointer)0x0) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar8,
                                                               "Assertion failed.");
                                                    pcVar9 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                    goto LAB_001e18a0;
                                                  }
                                                  if (local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ == 2) {
                                                    iVar14 = 0;
                                                    do {
                                                      uVar15 = 0;
                                                      do {
                                                        if (uVar15 < 3) {
                                                          piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,uVar15,iVar14);
                                                  if (*piVar4 != local_98->scalar_) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  else {
                                                    piVar4 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  &local_90,uVar15,iVar14);
                                                  if (*piVar4 != 3) {
                                                    plVar8 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar8,"test failed.");
                                                    __cxa_throw(plVar8,&std::logic_error::typeinfo,
                                                                std::logic_error::~logic_error);
                                                  }
                                                  }
                                                  uVar15 = uVar15 + 1;
                                                  } while (uVar15 != 6);
                                                  iVar14 = iVar14 + 1;
                                                  } while (iVar14 != 4);
                                                  operator_delete(_Var7._M_current,0x10);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .data_,local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.size_ << 2);
                                                  operator_delete(local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.shape_,
                                                  local_90.
                                                  super_View<int,_false,_std::allocator<unsigned_long>_>
                                                  .geometry_.dimension_ * 0x18);
                                                  operator_delete(_Var2._M_current,0x18);
                                                  return;
                                                  }
                                                  }
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_001e18a0:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_001e186e:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_001e13e5:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  plVar8 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar8,"test failed.");
                                                  pcVar9 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_001e13b3:
                                                  __cxa_throw(plVar8,puVar13,pcVar9);
                                                  }
                                                  }
                                                }
                                              }
                                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar8,"test failed.");
                                              pcVar9 = std::logic_error::~logic_error;
                                              puVar13 = &std::logic_error::typeinfo;
LAB_001e1381:
                                              __cxa_throw(plVar8,puVar13,pcVar9);
                                            }
                                          }
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar8,"test failed.");
                                          pcVar9 = std::logic_error::~logic_error;
                                          puVar13 = &std::logic_error::typeinfo;
LAB_001e17af:
                                          __cxa_throw(plVar8,puVar13,pcVar9);
                                        }
                                      }
                                    }
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar8,"test failed.");
                                    pcVar9 = std::logic_error::~logic_error;
                                    puVar13 = &std::logic_error::typeinfo;
LAB_001e174b:
                                    __cxa_throw(plVar8,puVar13,pcVar9);
                                  }
                                }
                              }
                              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar8,"test failed.");
                              pcVar9 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
LAB_001e1719:
                              __cxa_throw(plVar8,puVar13,pcVar9);
                            }
                          }
                        }
                      }
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar8,"test failed.");
                      pcVar9 = std::logic_error::~logic_error;
                      puVar13 = &std::logic_error::typeinfo;
LAB_001e134f:
                      __cxa_throw(plVar8,puVar13,pcVar9);
                    }
                  }
                }
              }
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar8,"test failed.");
              pcVar9 = std::logic_error::~logic_error;
              puVar13 = &std::logic_error::typeinfo;
LAB_001e131d:
              __cxa_throw(plVar8,puVar13,pcVar9);
            }
          }
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar13 = &std::logic_error::typeinfo;
LAB_001e1689:
          __cxa_throw(plVar8,puVar13,pcVar9);
        }
      }
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar8,"test failed.");
      pcVar9 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
LAB_001e1625:
      __cxa_throw(plVar8,puVar13,pcVar9);
    }
  }
  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar8,"test failed.");
  pcVar9 = std::logic_error::~logic_error;
  puVar13 = &std::logic_error::typeinfo;
LAB_001e15f3:
  __cxa_throw(plVar8,puVar13,pcVar9);
}

Assistant:

void MarrayTest::resizeTest() {
    // 1D
    {
        // shrink
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 12; 
            m.resize(shape.begin(), shape.end(), 12);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
        }
        // shrink to dimension == 0 
        {
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            m.resize(shape0.begin(), shape0.end(), 1);
        }
        // shrink to scalar 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 1; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==1 &&
                   m.size()==1 && 
                   m(0) == scalar_);
        }
        // grow scalar to 1D
        {
            int scalar = 1;
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(scalar);
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension() == 1);
            test(m(0) == 1);
            for(int i = 1; i < 24; ++i){
                test(m(i) == 3);
            }
        }
        // grow 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 24; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension()==1);
            for(int i = 0; i < 24; ++i){
                if(i < 12) {
                    test(m(i) == scalar_);
                }
                else {
                    test(m(i) == 3); 
                }
            }
        }
        // grow scalar to 3D
        {
            int scalar = 1;
            andres::Marray<int> m(scalar); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y == 0 && z == 0 && x == 0) {
                        test(m(x, y, z) == 1);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y) {
                for(int x = 0; x < 5; ++x) {
                    if(y == 0 && z == 0 && x < 5) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 2D 
    {
        // shrink
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 3; 
            shape[1] = 2; 
            m.resize(shape.begin(), shape.end(), 6);

            test(m.shape(0)==3 &&
                   m.shape(1)==2 &&
                   m.size()==6 &&
                   m.dimension()==2);
        }
        // grow
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 6; 
            shape[1] = 4; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 2 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;

            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 6; ++i)
                test(m(i) == scalar_);
            for(int i = 6; i < 12; ++i)
                test(m(i) == 3);
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 2 && z == 0 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 3D
    {
        // shrink
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 2;
            shape[1] = 2; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 8);
        
            test(m.shape(0)==2 &&
                   m.shape(1)==2 &&
                   m.shape(2)==2 &&
                   m.size()==8 &&
                   m.dimension()==3);
        }
        // grow
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 5;
            shape[1] = 5; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }                   
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m(0) == scalar_);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 3; ++i)
                test(m(i) == scalar_);
            for(int i = 3; i < 12; ++i)
                test(m(i) == 3);
        }
        // shrink to 2D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(2); 
            newShape[0] = 6; 
            newShape[1] = 4; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
    }
}